

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

long __thiscall
mkvparser::Chapters::Edition::ParseAtom
          (Edition *this,IMkvReader *pReader,longlong pos,longlong size)

{
  longlong *plVar1;
  int iVar2;
  Atom *pAVar3;
  bool bVar4;
  long lVar5;
  
  bVar4 = ExpandAtomsArray(this);
  if (bVar4) {
    pAVar3 = this->m_atoms;
    iVar2 = this->m_atoms_count;
    this->m_atoms_count = iVar2 + 1;
    pAVar3[iVar2].m_string_uid = (char *)0x0;
    pAVar3[iVar2].m_uid = 0;
    plVar1 = &pAVar3[iVar2].m_start_timecode;
    *(undefined4 *)plVar1 = 0xffffffff;
    *(undefined4 *)((long)plVar1 + 4) = 0xffffffff;
    *(undefined4 *)(plVar1 + 1) = 0xffffffff;
    *(undefined4 *)((long)plVar1 + 0xc) = 0xffffffff;
    pAVar3[iVar2].m_displays = (Display *)0x0;
    (&pAVar3[iVar2].m_displays)[1] = (Display *)0x0;
    lVar5 = Atom::Parse(pAVar3 + iVar2,pReader,pos,size);
    return lVar5;
  }
  return -1;
}

Assistant:

long Chapters::Edition::ParseAtom(IMkvReader* pReader, long long pos,
                                  long long size) {
  if (!ExpandAtomsArray())
    return -1;

  Atom& a = m_atoms[m_atoms_count++];
  a.Init();

  return a.Parse(pReader, pos, size);
}